

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::FramebufferVkImpl::FramebufferVkImpl
          (FramebufferVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          FramebufferDesc *Desc)

{
  uint uVar1;
  IRenderPass *pSrcPtr;
  ITextureView *pSrcPtr_00;
  ulong uVar2;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> vkImgViews;
  VkFramebufferCreateInfo FramebufferCI;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_a0;
  VkFramebufferCreateInfo local_88;
  FramebufferWrapper local_40;
  
  FramebufferBase<Diligent::EngineVkImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebufferVk>.super_RefCountedObject<Diligent::IFramebufferVk>.
  super_IFramebufferVk.super_IFramebuffer.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00935658;
  (this->m_VkFramebuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VkFramebuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VkFramebuffer).m_VkObject = (VkFramebuffer_T *)0x0;
  local_88.renderPass = (VkRenderPass)0x0;
  local_88.width = 0;
  local_88.height = 0;
  local_88.layers = 0;
  local_88._60_4_ = 0;
  local_88.attachmentCount = 0;
  local_88._36_4_ = 0;
  local_88.pAttachments = (VkImageView *)0x0;
  local_88.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_88._4_4_ = 0;
  local_88.pNext = (void *)0x0;
  local_88.flags = 0;
  local_88._20_4_ = 0;
  pSrcPtr = (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
            .m_Desc.pRenderPass;
  if (pSrcPtr != (IRenderPass *)0x0) {
    CheckDynamicType<Diligent::RenderPassVkImpl,Diligent::IRenderPass>(pSrcPtr);
  }
  local_88.renderPass = (VkRenderPass)pSrcPtr[0x13].super_IDeviceObject.super_IObject._vptr_IObject;
  uVar1 = (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
          .m_Desc.AttachmentCount;
  local_88.attachmentCount = uVar1;
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
            (&local_a0,(ulong)uVar1,(allocator_type *)&local_40);
  if ((this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      .m_Desc.AttachmentCount != 0) {
    uVar2 = 0;
    do {
      pSrcPtr_00 = (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                   .m_Desc.ppAttachments[uVar2];
      if (pSrcPtr_00 != (ITextureView *)0x0) {
        CheckDynamicType<Diligent::TextureViewVkImpl,Diligent::ITextureView>(pSrcPtr_00);
        local_a0.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] =
             (VkImageView_T *)pSrcPtr_00[0xf].super_IDeviceObject.super_IObject._vptr_IObject;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                     .m_Desc.AttachmentCount);
  }
  local_88.pAttachments =
       local_a0.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.width =
       (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.Width;
  local_88.height =
       (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.Height;
  local_88.layers =
       (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.NumArraySlices;
  VulkanUtilities::VulkanLogicalDevice::CreateFramebuffer
            (&local_40,
             (pDevice->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&local_88,
             (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
  operator=(&this->m_VkFramebuffer,&local_40);
  VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
  ~VulkanObjectWrapper(&local_40);
  if ((this->m_VkFramebuffer).m_VkObject == (VkFramebuffer_T *)0x0) {
    LogError<true,char[36]>
              (false,"FramebufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferVkImpl.cpp"
               ,0x4e,(char (*) [36])"Failed to create Vulkan framebuffer");
  }
  if (local_a0.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

FramebufferVkImpl::FramebufferVkImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceVkImpl*    pDevice,
                                     const FramebufferDesc& Desc) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    VkFramebufferCreateInfo FramebufferCI = {};

    FramebufferCI.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
    FramebufferCI.pNext = nullptr;
    FramebufferCI.flags = 0;

    auto* pRenderPassVkImpl  = ClassPtrCast<RenderPassVkImpl>(m_Desc.pRenderPass);
    FramebufferCI.renderPass = pRenderPassVkImpl->GetVkRenderPass();

    FramebufferCI.attachmentCount = m_Desc.AttachmentCount;

    std::vector<VkImageView> vkImgViews(m_Desc.AttachmentCount);
    for (Uint32 i = 0; i < m_Desc.AttachmentCount; ++i)
    {
        if (auto* pView = m_Desc.ppAttachments[i])
        {
            vkImgViews[i] = ClassPtrCast<TextureViewVkImpl>(pView)->GetVulkanImageView();
        }
    }
    FramebufferCI.pAttachments = vkImgViews.data();

    FramebufferCI.width  = m_Desc.Width;
    FramebufferCI.height = m_Desc.Height;
    FramebufferCI.layers = m_Desc.NumArraySlices;

    const auto& LogicalDevice = pDevice->GetLogicalDevice();

    m_VkFramebuffer = LogicalDevice.CreateFramebuffer(FramebufferCI, m_Desc.Name);
    if (!m_VkFramebuffer)
    {
        LOG_ERROR_AND_THROW("Failed to create Vulkan framebuffer");
    }
}